

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmMove5<(moira::Instr)71,(moira::Mode)4,(moira::Size)4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  Ea<(moira::Mode)5,_(moira::Size)4> dst;
  Ea<(moira::Mode)4,_(moira::Size)4> src;
  Ea<(moira::Mode)5,_(moira::Size)4> local_48;
  Ea<(moira::Mode)4,_(moira::Size)4> local_34;
  
  local_34.reg = op & 7;
  local_48.pc = *addr;
  local_48.reg = op >> 9 & 7;
  local_34.pc = local_48.pc;
  local_48.ext1 = dasmRead<(moira::Size)2>(this,addr);
  pSVar1 = StrWriter::operator<<(str);
  pSVar1 = StrWriter::operator<<(pSVar1);
  StrWriter::operator<<(pSVar1,(Align)(this->tab).raw);
  pSVar1 = StrWriter::operator<<(pSVar1,&local_34);
  StrWriter::operator<<(pSVar1,", ");
  StrWriter::operator<<(pSVar1,&local_48);
  return;
}

Assistant:

void
Moira::dasmMove5(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Op <M,S>       ( _____________xxx(op), addr );
    auto dst = Op <MODE_DI,S> ( ____xxx_________(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}